

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O0

void __thiscall
iutest::detail::
TypeParamTestInstance<iu_StringSplitRvalue_x_iutest_x_SplitBySingeChar_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
::EachTest<iutest::detail::VariadicTypeList<char16_t,_char32_t>,_void>::EachTest
          (EachTest<iutest::detail::VariadicTypeList<char16_t,_char32_t>,_void> *this,char *testcase
          ,char *name,size_t index)

{
  TestCase *p;
  size_t index_local;
  char *name_local;
  char *testcase_local;
  EachTest<iutest::detail::VariadicTypeList<char16_t,_char32_t>,_void> *this_local;
  
  p = AddTestCase(testcase,index);
  TestCaseMediator::TestCaseMediator(&this->m_mediator,p);
  TestInfo::TestInfo(&this->m_info,(iuITestCaseMediator *)this,name,
                     &(this->m_factory).super_iuFactoryBase);
  iuFactory<iu_StringSplitRvalue_x_iutest_x_SplitBySingeChar_Test<char16_t>_>::iuFactory
            (&this->m_factory);
  TypeParamTestInstance<iu_StringSplitRvalue_x_iutest_x_SplitBySingeChar_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
  ::EachTest<iutest::detail::VariadicTypeList<char32_t>,_void>::EachTest
            (&this->m_next,testcase,name,index + 1);
  return;
}

Assistant:

EachTest(const char* testcase, const char* name, size_t index)
            : m_mediator(AddTestCase(testcase, index))
            , m_info(&m_mediator, name, &m_factory)
            , m_next(testcase, name, index+1)
        {
        }